

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

int addUpvalue(Compiler *compiler,uint8_t index,_Bool isLocal)

{
  int iVar1;
  ObjFunction *pOVar2;
  bool bVar3;
  int iVar4;
  ulong in_RAX;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar4 = (int)in_RAX;
  pOVar2 = compiler->function;
  iVar1 = pOVar2->upvalueCount;
  uVar5 = (ulong)iVar1;
  bVar7 = 0 < (long)uVar5;
  if (0 < (long)uVar5) {
    uVar6 = 0;
    do {
      bVar3 = true;
      if ((compiler->upvalues[uVar6].index == index) &&
         (compiler->upvalues[uVar6].isLocal == isLocal)) {
        bVar3 = false;
        in_RAX = uVar6 & 0xffffffff;
      }
      iVar4 = (int)in_RAX;
      if (!bVar3) break;
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < uVar5;
    } while (uVar6 != uVar5);
  }
  if (!bVar7) {
    if (iVar1 == 0x100) {
      errorAt(&parser.previous,"Too many closure variables in function.");
      iVar4 = 0;
    }
    else {
      compiler->upvalues[uVar5].isLocal = isLocal;
      compiler->upvalues[uVar5].index = index;
      pOVar2->upvalueCount = iVar1 + 1;
      iVar4 = iVar1;
    }
  }
  return iVar4;
}

Assistant:

static int addUpvalue(Compiler* compiler, uint8_t index, bool isLocal) {
    /**
     * before we add a new upvalue,
     * we first check to see if the function already has an upvalue that closes over that variable:
     */
    int upvalueCount = compiler->function->upvalueCount;
    for (int i = 0; i < upvalueCount; i++) {
        Upvalue* upvalue = &compiler->upvalues[i];
        if (upvalue->index == index && upvalue->isLocal == isLocal) {
            return i;
        }
    }

    //ensure the compiler doesn’t overflow that limit:
    if (upvalueCount == UINT8_COUNT) {
        error("Too many closure variables in function.");
        return 0;
    }

    // if be functions hasn't the upvalue create new one
    compiler->upvalues[upvalueCount].isLocal = isLocal;
    compiler->upvalues[upvalueCount].index = index;
    return compiler->function->upvalueCount++;
}